

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_import_ugrid_tets(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT face_id;
  REF_INT qua;
  REF_INT nodes [27];
  long local_90;
  REF_GLOB global;
  REF_INT tri;
  REF_INT node;
  REF_INT orig_nnode;
  REF_INT new_node;
  REF_DBL xyz [3];
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  file = (FILE *)ref_grid->node;
  ref_cell = (REF_CELL)filename;
  filename_local = (char *)ref_grid;
  _ntri = fopen(filename,"r");
  if (_ntri == (FILE *)0x0) {
    printf("unable to open %s\n",ref_cell);
  }
  if (_ntri == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x932,
           "ref_import_ugrid_tets","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    iVar1 = __isoc99_fscanf(_ntri,"%d",&nqua);
    if (iVar1 == 1) {
      iVar1 = __isoc99_fscanf(_ntri,"%d",&ntet);
      if (iVar1 == 1) {
        iVar1 = __isoc99_fscanf(_ntri,"%d",&npyr);
        if (iVar1 == 1) {
          iVar1 = __isoc99_fscanf(_ntri,"%d",&npri);
          if (iVar1 == 1) {
            iVar1 = __isoc99_fscanf(_ntri,"%d",&nhex);
            if (iVar1 == 1) {
              iVar1 = __isoc99_fscanf(_ntri,"%d",local_50);
              if (iVar1 == 1) {
                iVar1 = __isoc99_fscanf(_ntri,"%d",local_54);
                if (iVar1 == 1) {
                  tri = file->_flags;
                  for (global._4_4_ = 0; global._4_4_ < nqua; global._4_4_ = global._4_4_ + 1) {
                    iVar1 = __isoc99_fscanf(_ntri,"%lf",&orig_nnode);
                    if ((long)iVar1 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x93f,"ref_import_ugrid_tets","x",1,(long)iVar1);
                      return 1;
                    }
                    iVar1 = __isoc99_fscanf(_ntri,"%lf",xyz);
                    if ((long)iVar1 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x940,"ref_import_ugrid_tets","y",1,(long)iVar1);
                      return 1;
                    }
                    iVar1 = __isoc99_fscanf(_ntri,"%lf",xyz + 1);
                    if ((long)iVar1 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x941,"ref_import_ugrid_tets","z",1,(long)iVar1);
                      return 1;
                    }
                    if (tri <= global._4_4_) {
                      uVar2 = ref_node_next_global((REF_NODE)file,&local_90);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x943,"ref_import_ugrid_tets",(ulong)uVar2,"next global");
                        return uVar2;
                      }
                      if (global._4_4_ != local_90) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x944,"ref_import_ugrid_tets","global node index",(long)global._4_4_
                               ,local_90);
                        return 1;
                      }
                      uVar2 = ref_node_add((REF_NODE)file,local_90,&node);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x945,"ref_import_ugrid_tets",(ulong)uVar2,"new_node");
                        return uVar2;
                      }
                      if ((long)global._4_4_ != (long)node) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x946,"ref_import_ugrid_tets","node index",(long)global._4_4_,
                               (long)node);
                        return 1;
                      }
                      *(undefined8 *)(file->_IO_buf_base + (long)(node * 0xf) * 8) = _orig_nnode;
                      *(REF_DBL *)(file->_IO_buf_base + (long)(node * 0xf + 1) * 8) = xyz[0];
                      *(REF_DBL *)(file->_IO_buf_base + (long)(node * 0xf + 2) * 8) = xyz[1];
                    }
                  }
                  for (global._0_4_ = 0; (int)global < ntet; global._0_4_ = (int)global + 1) {
                    for (global._4_4_ = 0; global._4_4_ < 3; global._4_4_ = global._4_4_ + 1) {
                      iVar1 = __isoc99_fscanf(_ntri,"%d",&face_id + global._4_4_);
                      if (iVar1 != 1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x94f,"ref_import_ugrid_tets","tri");
                        return 1;
                      }
                    }
                  }
                  for (cell = 0; cell < npyr; cell = cell + 1) {
                    for (global._4_4_ = 0; global._4_4_ < 4; global._4_4_ = global._4_4_ + 1) {
                      iVar1 = __isoc99_fscanf(_ntri,"%d",&face_id + global._4_4_);
                      if (iVar1 != 1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x953,"ref_import_ugrid_tets","qua");
                        return 1;
                      }
                    }
                  }
                  for (global._0_4_ = 0; (int)global < ntet; global._0_4_ = (int)global + 1) {
                    iVar1 = __isoc99_fscanf(_ntri,"%d",&new_cell);
                    if (iVar1 != 1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x957,"ref_import_ugrid_tets","tri id");
                      return 1;
                    }
                  }
                  for (cell = 0; cell < npyr; cell = cell + 1) {
                    iVar1 = __isoc99_fscanf(_ntri,"%d",&new_cell);
                    if (iVar1 != 1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x95b,"ref_import_ugrid_tets","qua id");
                      return 1;
                    }
                  }
                  ref_node = *(REF_NODE *)(filename_local + 0x50);
                  for (ref_private_status_reis_ai._4_4_ = 0; ref_private_status_reis_ai._4_4_ < npri
                      ; ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
                    for (global._4_4_ = 0; global._4_4_ < 4; global._4_4_ = global._4_4_ + 1) {
                      iVar1 = __isoc99_fscanf(_ntri,"%d",&face_id + global._4_4_);
                      if (iVar1 != 1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x961,"ref_import_ugrid_tets","tet");
                        return 1;
                      }
                    }
                    face_id = face_id + -1;
                    qua = qua + -1;
                    nodes[0] = nodes[0] + -1;
                    nodes[1] = nodes[1] + -1;
                    uVar2 = ref_cell_add((REF_CELL)ref_node,&face_id,
                                         (REF_INT *)&ref_private_status_reis_ai);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x966,"ref_import_ugrid_tets",(ulong)uVar2,"new tet");
                      return uVar2;
                    }
                    if (ref_private_status_reis_ai._4_4_ != (int)ref_private_status_reis_ai) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x967,"ref_import_ugrid_tets","tet index");
                      return 1;
                    }
                  }
                  fclose(_ntri);
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x93a,"ref_import_ugrid_tets","nhex");
                  ref_grid_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x939,"ref_import_ugrid_tets","npri");
                ref_grid_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x938,"ref_import_ugrid_tets","npyr");
              ref_grid_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x937,"ref_import_ugrid_tets","ntet");
            ref_grid_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x936,"ref_import_ugrid_tets","nqua");
          ref_grid_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x935,"ref_import_ugrid_tets","ntri");
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x934,
             "ref_import_ugrid_tets","nnode");
      ref_grid_local._4_4_ = 1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_ugrid_tets(REF_GRID ref_grid,
                                                const char *filename) {
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_DBL xyz[3];
  REF_INT new_node, orig_nnode, node, tri;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua;
  REF_INT face_id;
  REF_INT cell, new_cell;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &nnode), "nnode");
  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &nqua), "nqua");
  RES(1, fscanf(file, "%d", &ntet), "ntet");
  RES(1, fscanf(file, "%d", &npyr), "npyr");
  RES(1, fscanf(file, "%d", &npri), "npri");
  RES(1, fscanf(file, "%d", &nhex), "nhex");

  orig_nnode = ref_node_n(ref_node);

  for (node = 0; node < nnode; node++) {
    REIS(1, fscanf(file, "%lf", &(xyz[0])), "x");
    REIS(1, fscanf(file, "%lf", &(xyz[1])), "y");
    REIS(1, fscanf(file, "%lf", &(xyz[2])), "z");
    if (node >= orig_nnode) {
      RSS(ref_node_next_global(ref_node, &global), "next global");
      REIS(node, global, "global node index");
      RSS(ref_node_add(ref_node, global, &new_node), "new_node");
      REIS(node, new_node, "node index");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2];
    }
  }

  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
  }
  for (qua = 0; qua < nqua; qua++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "qua");
  }

  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
  }

  for (qua = 0; qua < nqua; qua++) {
    RES(1, fscanf(file, "%d", &face_id), "qua id");
  }

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  return REF_SUCCESS;
}